

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void keyboardHandleEnter(void *userData,wl_keyboard *keyboard,uint32_t serial,wl_surface *surface,
                        wl_array *keys)

{
  char **ppcVar1;
  _GLFWwindow *window_00;
  wl_proxy *in_RCX;
  uint32_t in_EDX;
  _GLFWwindow *window;
  GLFWbool in_stack_ffffffffffffffcc;
  
  if (((in_RCX != (wl_proxy *)0x0) &&
      (ppcVar1 = (*_glfw.wl.client.proxy_get_tag)(in_RCX), ppcVar1 == (char **)0x3870ff8)) &&
     (window_00 = (_GLFWwindow *)wl_surface_get_user_data((wl_surface *)0xb11194),
     in_RCX == (wl_proxy *)(window_00->wl).surface)) {
    _glfw.wl.serial = in_EDX;
    _glfw.wl.keyboardFocus = window_00;
    _glfwInputWindowFocus(window_00,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

static void keyboardHandleEnter(void* userData,
                                struct wl_keyboard* keyboard,
                                uint32_t serial,
                                struct wl_surface* surface,
                                struct wl_array* keys)
{
    // Happens in the case we just destroyed the surface.
    if (!surface)
        return;

    if (wl_proxy_get_tag((struct wl_proxy*) surface) != &_glfw.wl.tag)
        return;

    _GLFWwindow* window = wl_surface_get_user_data(surface);
    if (surface != window->wl.surface)
        return;

    _glfw.wl.serial = serial;
    _glfw.wl.keyboardFocus = window;
    _glfwInputWindowFocus(window, GLFW_TRUE);
}